

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_cstring.hpp
# Opt level: O1

bool __thiscall
std::less<boost::unit_test::basic_cstring<const_char>_>::operator()
          (less<boost::unit_test::basic_cstring<const_char>_> *this,basic_cstring<const_char> *__x,
          basic_cstring<const_char> *__y)

{
  char cVar1;
  iterator pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  pvVar2 = __x->m_begin;
  uVar3 = (long)__x->m_end - (long)pvVar2;
  uVar4 = (long)__y->m_end - (long)__y->m_begin;
  if (uVar3 != uVar4) {
    return uVar3 < uVar4;
  }
  if (__x->m_end != pvVar2) {
    uVar4 = 0;
    do {
      cVar1 = __y->m_begin[uVar4];
      if (pvVar2[uVar4] != cVar1) {
        return pvVar2[uVar4] < cVar1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return false;
}

Assistant:

inline typename basic_cstring<CharT>::size_type
basic_cstring<CharT>::size() const
{
    return static_cast<size_type>(m_end - m_begin);
}